

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall
dh::trival::trival(trival *this,trivalitem *res,string *operand,trivalitem *val1,trivalitem *val2)

{
  trivalitem *val2_local;
  trivalitem *val1_local;
  string *operand_local;
  trivalitem *res_local;
  trival *this_local;
  
  trivalitem::trivalitem(&this->_res);
  std::__cxx11::string::string((string *)&this->_operand);
  trivalitem::trivalitem(&this->_val1);
  trivalitem::trivalitem(&this->_val2);
  std::__cxx11::string::operator=((string *)this,(string *)res);
  (this->_res).type = res->type;
  std::__cxx11::string::operator=((string *)&this->_operand,(string *)operand);
  std::__cxx11::string::operator=((string *)&this->_val1,(string *)val1);
  (this->_val1).type = val1->type;
  std::__cxx11::string::operator=((string *)&this->_val2,(string *)val2);
  (this->_val2).type = val2->type;
  this->size = 3;
  return;
}

Assistant:

trival( trivalitem res, 
				::std::string operand, 
				trivalitem val1, 
				trivalitem val2)
		{
			this->_res.name = res.name;
			this->_res.type = res.type;
			this->_operand = operand;
			this->_val1.name = val1.name;
			this->_val1.type = val1.type;
			this->_val2.name = val2.name;
			this->_val2.type = val2.type;
			size = 3;
		}